

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionChecker.cpp
# Opt level: O0

void __thiscall RegionChecker::RegionChecker(RegionChecker *this,istream *file)

{
  bool bVar1;
  long in_RSI;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  istreambuf_iterator<char,_std::char_traits<char>_> iVar2;
  istreambuf_iterator<char,_std::char_traits<char>_> iter;
  istreambuf_iterator<char,_std::char_traits<char>_> *in_stack_ffffffffffffff28;
  istreambuf_iterator<char,_std::char_traits<char>_> *in_stack_ffffffffffffff30;
  allocator_type *__a;
  undefined4 in_stack_ffffffffffffff38;
  int_type in_stack_ffffffffffffff3c;
  istreambuf_iterator<char,_std::char_traits<char>_> *in_stack_ffffffffffffff40;
  allocator_type local_79 [8];
  undefined1 in_stack_ffffffffffffff8f;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff90;
  
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x11f4a1);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x11f4b4);
  std::istream::seekg(in_RSI,_S_beg);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            (in_stack_ffffffffffffff40,
             (istream_type *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  while( true ) {
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              (in_stack_ffffffffffffff30);
    bVar1 = std::operator!=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if (!bVar1) break;
    std::istreambuf_iterator<char,_std::char_traits<char>_>::operator*(in_stack_ffffffffffffff30);
    std::vector<bool,_std::allocator<bool>_>::push_back
              (in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff8f);
    iVar2 = std::istreambuf_iterator<char,_std::char_traits<char>_>::operator++
                      ((istreambuf_iterator<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                       (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    in_stack_ffffffffffffff40 = (istreambuf_iterator<char,_std::char_traits<char>_> *)iVar2._M_sbuf;
    in_stack_ffffffffffffff3c = iVar2._M_c;
  }
  std::istream::seekg(in_RSI,_S_beg);
  std::vector<bool,_std::allocator<bool>_>::size(in_RDI);
  __a = local_79;
  std::allocator<bool>::allocator((allocator<bool> *)0x11f5d0);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff40,
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),__a);
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff40,
             (vector<bool,_std::allocator<bool>_> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x11f5fe)
  ;
  std::allocator<bool>::~allocator((allocator<bool> *)0x11f608);
  return;
}

Assistant:

RegionChecker::RegionChecker(std::istream &file) {
	file.seekg(0, file.beg);
	std::istreambuf_iterator<char> iter(file);
	while (iter != std::istreambuf_iterator<char>()) {
		fileUsage.push_back(*iter != 0);
		iter++;
	}
	file.seekg(0, file.beg);
	usedBits = std::vector<bool>(fileUsage.size());
}